

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O1

void __thiscall
TPZMatrix<Fad<float>_>::MultAdd
          (TPZMatrix<Fad<float>_> *this,TPZFMatrix<Fad<float>_> *x,TPZFMatrix<Fad<float>_> *y,
          TPZFMatrix<Fad<float>_> *z,Fad<float> *alpha,Fad<float> *beta,int opt)

{
  uint uVar1;
  long lVar2;
  long lVar3;
  Fad<float> *pFVar4;
  uint uVar5;
  int iVar6;
  TPZFMatrix<Fad<float>_> *pTVar7;
  float *pfVar8;
  long lVar9;
  long lVar10;
  float *pfVar11;
  ulong uVar12;
  long lVar13;
  int sz;
  long lVar14;
  long lVar15;
  Fad<float> val;
  Fad<float> local_100;
  Fad<float> local_e0;
  int64_t local_c0;
  long local_b8;
  TPZFMatrix<Fad<float>_> *local_b0;
  FadExpr<FadBinaryMul<Fad<float>,_Fad<float>_>_> local_a8;
  float *local_98;
  Fad<float> local_90;
  Fad<float> *local_70;
  Fad<float> *local_68;
  Fad<float> **local_60;
  Fad<float> *local_58;
  Fad<float> local_50;
  
  if (((opt == 0) &&
      ((this->super_TPZBaseMatrix).fCol !=
       (x->super_TPZMatrix<Fad<float>_>).super_TPZBaseMatrix.fRow)) ||
     ((this->super_TPZBaseMatrix).fRow != (x->super_TPZMatrix<Fad<float>_>).super_TPZBaseMatrix.fRow
     )) {
    Error("Operator* <matrices with incompatible dimensions>",(char *)0x0);
  }
  if (((x->super_TPZMatrix<Fad<float>_>).super_TPZBaseMatrix.fCol !=
       (y->super_TPZMatrix<Fad<float>_>).super_TPZBaseMatrix.fCol) ||
     ((x->super_TPZMatrix<Fad<float>_>).super_TPZBaseMatrix.fRow !=
      (y->super_TPZMatrix<Fad<float>_>).super_TPZBaseMatrix.fRow)) {
    Error("TPZFMatrix::MultiplyAdd incompatible dimensions\n",(char *)0x0);
  }
  lVar2 = (this->super_TPZBaseMatrix).fRow;
  lVar3 = (this->super_TPZBaseMatrix).fCol;
  local_c0 = (x->super_TPZMatrix<Fad<float>_>).super_TPZBaseMatrix.fCol;
  local_90.val_ = beta->val_;
  uVar1 = (beta->dx_).num_elts;
  local_90.dx_.ptr_to_data = (float *)0x0;
  local_90.dx_.num_elts = uVar1;
  if ((long)(int)uVar1 != 0) {
    uVar12 = 0xffffffffffffffff;
    if (-1 < (int)uVar1) {
      uVar12 = (long)(int)uVar1 << 2;
    }
    local_90.dx_.ptr_to_data = (float *)operator_new__(uVar12);
    MEM_CPY<float>::copy
              ((MEM_CPY<float> *)local_90.dx_.ptr_to_data,(EVP_PKEY_CTX *)(beta->dx_).ptr_to_data,
               (EVP_PKEY_CTX *)(ulong)uVar1);
  }
  local_90.defaultVal = beta->defaultVal;
  local_b0 = x;
  PrepareZ(this,y,z,&local_90,opt);
  Fad<float>::~Fad(&local_90);
  local_100.val_ = 0.0;
  local_100.dx_.num_elts = 0;
  local_100.dx_.ptr_to_data = (float *)0x0;
  local_100.defaultVal = 0.0;
  if (0 < local_c0) {
    local_98 = &alpha->defaultVal;
    local_b8 = 0;
    lVar9 = 0;
    do {
      if (opt == 0) {
        if (0 < lVar3) {
          lVar10 = 0;
          do {
            if (0 < lVar2) {
              lVar14 = 0;
              lVar15 = 0;
              do {
                if (((z->super_TPZMatrix<Fad<float>_>).super_TPZBaseMatrix.fRow <= lVar15) ||
                   ((z->super_TPZMatrix<Fad<float>_>).super_TPZBaseMatrix.fCol <= lVar9)) {
                  TPZFMatrix<Fad<float>_>::Error
                            ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                  pzinternal::DebugStopImpl
                            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                             ,0x26d);
                }
                lVar13 = (z->super_TPZMatrix<Fad<float>_>).super_TPZBaseMatrix.fRow * local_b8;
                pFVar4 = z->fElem;
                (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                          (&local_e0,this,lVar15,lVar10);
                local_70 = alpha;
                local_68 = &local_e0;
                (*(local_b0->super_TPZMatrix<Fad<float>_>).super_TPZBaseMatrix.super_TPZSavable.
                  _vptr_TPZSavable[0x24])(&local_50,local_b0,lVar10,lVar9);
                local_a8.fadexpr_.left_ = (Fad<float> *)((long)&pFVar4->val_ + lVar14 + lVar13);
                local_60 = &local_70;
                local_a8.fadexpr_.right_ = (Fad<float> *)&local_60;
                local_58 = &local_50;
                Fad<float>::operator=
                          (&local_100,
                           (FadExpr<FadBinaryAdd<Fad<float>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<float>,_Fad<float>_>_>,_Fad<float>_>_>_>_>
                            *)&local_a8);
                Fad<float>::~Fad(&local_50);
                Fad<float>::~Fad(&local_e0);
                (*(z->super_TPZMatrix<Fad<float>_>).super_TPZBaseMatrix.super_TPZSavable.
                  _vptr_TPZSavable[0x23])(z,lVar15,lVar9);
                lVar15 = lVar15 + 1;
                lVar14 = lVar14 + 0x20;
              } while (lVar2 != lVar15);
            }
            lVar10 = lVar10 + 1;
          } while (lVar10 != lVar3);
        }
      }
      else if (0 < lVar2) {
        lVar10 = 0;
        do {
          pTVar7 = local_b0;
          local_100.val_ = 0.0;
          if (local_100.dx_.num_elts != 0) {
            local_e0.val_ = 0.0;
            Vector<float>::operator=(&local_100.dx_,&local_e0.val_);
          }
          if (0 < lVar3) {
            lVar14 = 0;
            do {
              (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                        (&local_e0,this,lVar14,lVar10);
              (*(pTVar7->super_TPZMatrix<Fad<float>_>).super_TPZBaseMatrix.super_TPZSavable.
                _vptr_TPZSavable[0x24])(&local_50,pTVar7,lVar14);
              local_a8.fadexpr_.left_ = &local_e0;
              local_a8.fadexpr_.right_ = &local_50;
              Fad<float>::operator+=(&local_100,&local_a8);
              Fad<float>::~Fad(&local_50);
              Fad<float>::~Fad(&local_e0);
              lVar14 = lVar14 + 1;
            } while (lVar3 != lVar14);
          }
          iVar6 = local_100.dx_.num_elts;
          local_e0.val_ = alpha->val_ * local_100.val_;
          uVar1 = (alpha->dx_).num_elts;
          uVar5 = local_100.dx_.num_elts;
          if (local_100.dx_.num_elts < (int)uVar1) {
            uVar5 = uVar1;
          }
          local_e0.dx_.num_elts = 0;
          local_e0.dx_.ptr_to_data = (float *)0x0;
          if (0 < (int)uVar5) {
            uVar12 = (ulong)uVar5;
            local_e0.dx_.num_elts = uVar5;
            local_e0.dx_.ptr_to_data = (float *)operator_new__(uVar12 * 4);
            local_e0.defaultVal = 0.0;
            if (0 < (int)uVar5) {
              lVar14 = 0;
              do {
                pfVar8 = (float *)((long)(alpha->dx_).ptr_to_data + lVar14);
                if (uVar1 == 0) {
                  pfVar8 = local_98;
                }
                pfVar11 = (float *)((long)local_100.dx_.ptr_to_data + lVar14);
                if (iVar6 == 0) {
                  pfVar11 = &local_100.defaultVal;
                }
                *(float *)((long)local_e0.dx_.ptr_to_data + lVar14) =
                     *pfVar8 * local_100.val_ + *pfVar11 * alpha->val_;
                lVar14 = lVar14 + 4;
                uVar12 = uVar12 - 1;
              } while (uVar12 != 0);
            }
          }
          local_e0.defaultVal = 0.0;
          (*(z->super_TPZMatrix<Fad<float>_>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
            [0x23])(z,lVar10,lVar9);
          Fad<float>::~Fad(&local_e0);
          lVar10 = lVar10 + 1;
        } while (lVar10 != lVar2);
      }
      lVar9 = lVar9 + 1;
      local_b8 = local_b8 + 0x20;
    } while (lVar9 != local_c0);
  }
  Fad<float>::~Fad(&local_100);
  return;
}

Assistant:

void TPZMatrix<TVar>::MultAdd(const TPZFMatrix<TVar> &x,const TPZFMatrix<TVar> &y, TPZFMatrix<TVar> &z, const TVar alpha,const TVar beta,const int opt) const {
	if ((!opt && Cols() != x.Rows()) || Rows() != x.Rows())
		Error( "Operator* <matrices with incompatible dimensions>" );
	if(x.Cols() != y.Cols() || x.Rows() != y.Rows()) {
		Error ("TPZFMatrix::MultiplyAdd incompatible dimensions\n");
	}
	int64_t rows = Rows();
	int64_t cols = Cols();
	int64_t xcols = x.Cols();
	int64_t ic, c, r;
	PrepareZ(y,z,beta,opt);
	TVar val = 0.;
	for (ic = 0; ic < xcols; ic++) {
		if(!opt) {
			for ( c = 0; c<cols; c++) {
				for ( r = 0; r < rows; r++ ) {
					val = z(r,ic) + alpha * GetVal(r,c) * x.GetVal(c,ic);
					z.PutVal(r,ic,val);
				}
			}
		} else {
			for (r = 0; r<rows; r++) {
            	val = 0.;
				for(c = 0; c<cols; c++) {
					val += GetVal(c,r)* x.GetVal(c,ic);
				}
				z.PutVal(r,ic,alpha*val);
			}
		}
	}
}